

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pwm.c
# Opt level: O0

void PWM_Init(void *info)

{
  pwm_chip *chip;
  void *info_local;
  
  *(undefined1 *)((long)info + 0xc) = 0;
  *(undefined2 *)((long)info + 0xe) = 0;
  *(undefined2 *)((long)info + 0x10) = 0;
  PWM_Set_Cycle((pwm_chip *)info,0);
  PWM_Set_Int((pwm_chip *)info,'\0');
  return;
}

Assistant:

static void PWM_Init(void* info)
{
	pwm_chip* chip = (pwm_chip*)info;
	
	chip->PWM_Mode = 0;
	chip->PWM_Out_R = 0;
	chip->PWM_Out_L = 0;
	
	//PWM_Loudness = 0;
	PWM_Set_Cycle(chip, 0);
	PWM_Set_Int(chip, 0);
}